

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeIDMap::add(DOMNodeIDMap *this,DOMAttr *attr)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  bool bVar3;
  ulong local_30;
  XMLSize_t currentHash;
  XMLSize_t initalHash;
  XMLCh *id;
  DOMAttr *attr_local;
  DOMNodeIDMap *this_local;
  
  if (this->fMaxEntries <= this->fNumEntries) {
    growTable(this);
  }
  this->fNumEntries = this->fNumEntries + 1;
  iVar1 = (*(attr->super_DOMNode)._vptr_DOMNode[0x2a])();
  XVar2 = XMLString::hash((XMLCh *)CONCAT44(extraout_var,iVar1),this->fSize - 1);
  local_30 = XVar2 + 1;
  while( true ) {
    bVar3 = false;
    if (this->fTable[local_30] != (DOMAttr *)0x0) {
      bVar3 = this->fTable[local_30] != (DOMAttr *)0xffffffffffffffff;
    }
    if (!bVar3) break;
    local_30 = XVar2 + 1 + local_30;
    if (this->fSize <= local_30) {
      local_30 = local_30 % this->fSize;
    }
  }
  this->fTable[local_30] = attr;
  return;
}

Assistant:

void DOMNodeIDMap::add(DOMAttr *attr)
{
	//
	//  If the table is getting too full, grow it.  We arbitrarily limit
	//   the table to 80 full, which should limit the average number of
	//   rehashes to a reasonable value.
	//
	if (fNumEntries >= fMaxEntries)
		growTable();

        fNumEntries++;

	//
	// Hash the value string from the ID attribute being added to the table
	//      0 < Initial hash value < table size.
	//      An initial hash of zero would cause the rehash to fail.
	//
	const XMLCh *id=attr->getValue();
        XMLSize_t initalHash = XMLString::hash(id, fSize-1);
	initalHash++;
	XMLSize_t currentHash = initalHash;

	//
	// Loop looking for an empty slot for this ID.
	//   Don't even bother checking to see if the ID is already there -
	//   the table is only filled by the parser from valid documents, which
	//   can not have duplicates.  Behavior of invalid docs is not defined.
	//
    while (fTable[currentHash]!=0 && fTable[currentHash]!=(DOMAttr *)-1)
	{
		currentHash += initalHash;  // rehash
        if (currentHash >= fSize)
            currentHash = currentHash % fSize;
    }

    //
    // We've found our slot.  Stick the pointer to the attr into it.
    //
    fTable[currentHash] = attr;

}